

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O2

bool Function_Template::form2_Invert(InvertForm2 Invert)

{
  bool bVar1;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  ImageTemplate<unsigned_char> local_30;
  
  Unit_Test::intensityArray(&intensity,2);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_30,0,0,'\x01','\x01');
  Test_Helper::uniformImages(&input,&intensity,&local_30);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_30);
  (*Invert)(input.
            super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_start,
            input.
            super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
            ._M_impl.super__Vector_impl_data._M_start + 1);
  bVar1 = Unit_Test::verifyImage
                    (input.
                     super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + 1,
                     *intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start ^ 0xff);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&input);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&intensity.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return bVar1;
}

Assistant:

bool form2_Invert(InvertForm2 Invert)
    {
        const std::vector < uint8_t > intensity = intensityArray( 2 );
        std::vector < PenguinV_Image::Image > input = uniformImages( intensity );

        Invert( input[0], input[1] );

        return verifyImage( input[1], ~intensity[0] );
    }